

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_posix.h
# Opt level: O0

uint64_t snmalloc::PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::dev_urandom(void)

{
  int __fd;
  char *pcVar1;
  ssize_t sVar2;
  int *piVar3;
  char acVar4 [8];
  size_t length;
  char *target;
  char *current;
  int fd;
  int flags;
  ssize_t ret;
  anon_union_8_2_fa62e37e anon_var_0;
  char *local_20;
  char local_8 [8];
  
  __fd = open("/dev/urandom",0x80000,0);
  if (0 < __fd) {
    local_20 = std::begin<char,8ul>(&local_8);
    pcVar1 = std::end<char,8ul>(&local_8);
    do {
      while( true ) {
        if ((long)pcVar1 - (long)local_20 == 0) goto LAB_0010cc5d;
        sVar2 = read(__fd,local_20,(long)pcVar1 - (long)local_20);
        if (sVar2 < 1) break;
        local_20 = local_20 + sVar2;
      }
      piVar3 = __errno_location();
    } while ((*piVar3 == 0xb) || (piVar3 = __errno_location(), *piVar3 == 4));
LAB_0010cc5d:
    close(__fd);
    if (pcVar1 == local_20) {
      acVar4[0] = local_8[0];
      acVar4[1] = local_8[1];
      acVar4[2] = local_8[2];
      acVar4[3] = local_8[3];
      acVar4[4] = local_8[4];
      acVar4[5] = local_8[5];
      acVar4[6] = local_8[6];
      acVar4[7] = local_8[7];
      return (uint64_t)acVar4;
    }
  }
  error(target);
}

Assistant:

static uint64_t dev_urandom()
    {
      union
      {
        uint64_t result;
        char buffer[sizeof(uint64_t)];
      };

      ssize_t ret;
      int flags = O_RDONLY;
#if defined(O_CLOEXEC)
      flags |= O_CLOEXEC;
#endif
      auto fd = open("/dev/urandom", flags, 0);
      if (fd > 0)
      {
        auto current = stl::begin(buffer);
        auto target = stl::end(buffer);
        while (auto length = static_cast<size_t>(target - current))
        {
          ret = read(fd, current, length);
          if (ret <= 0)
          {
            if (errno != EAGAIN && errno != EINTR)
            {
              break;
            }
          }
          else
          {
            current += ret;
          }
        }
        ret = close(fd);
        SNMALLOC_ASSERT(0 == ret);
        if (SNMALLOC_LIKELY(target == current))
        {
          return result;
        }
      }

      error("Failed to get system randomness");
    }